

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::App::_process_env(App *this)

{
  bool bVar1;
  pointer puVar2;
  Option *pOVar3;
  pointer psVar4;
  element_type *peVar5;
  pointer pcVar6;
  char *__s;
  size_t sVar7;
  pointer puVar8;
  App_p *sub;
  pointer psVar9;
  string ename_string;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  App *local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar8 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  if (puVar8 != puVar2) {
    do {
      local_98 = local_88;
      pOVar3 = (puVar8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
               _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if ((*(pointer *)
            ((long)&(pOVar3->results_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            + 8) == *(pointer *)
                     &(pOVar3->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl) && ((pOVar3->envname_)._M_string_length != 0)) {
        local_90 = 0;
        local_88[0] = 0;
        __s = getenv((((puVar8->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->envname_).
                     _M_dataplus._M_p);
        if (__s != (char *)0x0) {
          local_50[0] = local_40;
          sVar7 = strlen(__s);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,__s + sVar7);
          ::std::__cxx11::string::operator=((string *)&local_98,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
        }
        if (local_90 != 0) {
          pOVar3 = (puVar8->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_98,local_98 + local_90);
          Option::_add_result(pOVar3,&local_70);
          pOVar3->callback_run_ = false;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar2);
  }
  psVar9 = (local_78->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (local_78->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar9 != psVar4) {
    do {
      peVar5 = (psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pcVar6 = (peVar5->name_)._M_dataplus._M_p;
      local_98 = local_88;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar6,pcVar6 + (peVar5->name_)._M_string_length);
      if (local_90 == 0) {
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
LAB_00145cc5:
        _process_env((psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      }
      else {
        bVar1 = ((psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                immediate_callback_;
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
        if (bVar1 == false) goto LAB_00145cc5;
      }
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar4);
  }
  return;
}

Assistant:

auto to_string(T &&value) -> decltype(std::forward<T>(value)) {
    return std::forward<T>(value);
}